

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void cmGlobalNinjaGenerator::WriteRule
               (ostream *os,string *name,string *command,string *description,string *comment,
               string *depfile,string *deptype,string *rspfile,string *rspcontent,string *restat,
               bool generator)

{
  ostream *poVar1;
  char *m2;
  char *m1;
  
  if (name->_M_string_length == 0) {
    m2 = (comment->_M_dataplus)._M_p;
    m1 = "No name given for WriteRuleStatement! called with comment: ";
  }
  else {
    if (command->_M_string_length != 0) {
      WriteComment(os,comment);
      poVar1 = std::operator<<(os,"rule ");
      poVar1 = std::operator<<(poVar1,(string *)name);
      std::operator<<(poVar1,"\n");
      if (depfile->_M_string_length != 0) {
        Indent(os,1);
        poVar1 = std::operator<<(os,"depfile = ");
        poVar1 = std::operator<<(poVar1,(string *)depfile);
        std::operator<<(poVar1,"\n");
      }
      if (deptype->_M_string_length != 0) {
        Indent(os,1);
        poVar1 = std::operator<<(os,"deps = ");
        poVar1 = std::operator<<(poVar1,(string *)deptype);
        std::operator<<(poVar1,"\n");
      }
      Indent(os,1);
      poVar1 = std::operator<<(os,"command = ");
      poVar1 = std::operator<<(poVar1,(string *)command);
      std::operator<<(poVar1,"\n");
      if (description->_M_string_length != 0) {
        Indent(os,1);
        poVar1 = std::operator<<(os,"description = ");
        poVar1 = std::operator<<(poVar1,(string *)description);
        std::operator<<(poVar1,"\n");
      }
      if (rspfile->_M_string_length != 0) {
        if (rspcontent->_M_string_length == 0) {
          m2 = (comment->_M_dataplus)._M_p;
          m1 = "No rspfile_content given!";
          goto LAB_0035f866;
        }
        Indent(os,1);
        poVar1 = std::operator<<(os,"rspfile = ");
        poVar1 = std::operator<<(poVar1,(string *)rspfile);
        std::operator<<(poVar1,"\n");
        Indent(os,1);
        poVar1 = std::operator<<(os,"rspfile_content = ");
        poVar1 = std::operator<<(poVar1,(string *)rspcontent);
        std::operator<<(poVar1,"\n");
      }
      if (restat->_M_string_length != 0) {
        Indent(os,1);
        poVar1 = std::operator<<(os,"restat = ");
        poVar1 = std::operator<<(poVar1,(string *)restat);
        std::operator<<(poVar1,"\n");
      }
      if (generator) {
        Indent(os,1);
        std::operator<<(os,"generator = 1\n");
      }
      std::operator<<(os,"\n");
      return;
    }
    m2 = (comment->_M_dataplus)._M_p;
    m1 = "No command given for WriteRuleStatement! called with comment: ";
  }
LAB_0035f866:
  cmSystemTools::Error(m1,m2,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteRule(
  std::ostream& os, const std::string& name, const std::string& command,
  const std::string& description, const std::string& comment,
  const std::string& depfile, const std::string& deptype,
  const std::string& rspfile, const std::string& rspcontent,
  const std::string& restat, bool generator)
{
  // Make sure the rule has a name.
  if (name.empty()) {
    cmSystemTools::Error("No name given for WriteRuleStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
  }

  // Make sure a command is given.
  if (command.empty()) {
    cmSystemTools::Error("No command given for WriteRuleStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);

  // Write the rule.
  os << "rule " << name << "\n";

  // Write the depfile if any.
  if (!depfile.empty()) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "depfile = " << depfile << "\n";
  }

  // Write the deptype if any.
  if (!deptype.empty()) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "deps = " << deptype << "\n";
  }

  // Write the command.
  cmGlobalNinjaGenerator::Indent(os, 1);
  os << "command = " << command << "\n";

  // Write the description if any.
  if (!description.empty()) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "description = " << description << "\n";
  }

  if (!rspfile.empty()) {
    if (rspcontent.empty()) {
      cmSystemTools::Error("No rspfile_content given!", comment.c_str());
      return;
    }
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "rspfile = " << rspfile << "\n";
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "rspfile_content = " << rspcontent << "\n";
  }

  if (!restat.empty()) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "restat = " << restat << "\n";
  }

  if (generator) {
    cmGlobalNinjaGenerator::Indent(os, 1);
    os << "generator = 1\n";
  }

  os << "\n";
}